

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_bfba::ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U>::
ktxTexture1WriteTestBase(ktxTexture1WriteTestBase<unsigned_short,_2U,_33324U> *this)

{
  char *pcVar1;
  size_type __dnew;
  size_type local_18;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ktxTexture1WriteTestBase_0019c028;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.writer_ktx2._M_dataplus._M_p =
       (pointer)&(this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.writer_ktx2.
                 field_2;
  local_18 = 0x1f;
  pcVar1 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)&(this->helper).
                                        super_WriterTestHelper<unsigned_short,_2U,_33324U>.
                                        writer_ktx2,(ulong)&local_18);
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.writer_ktx2._M_dataplus._M_p =
       pcVar1;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.writer_ktx2.field_2.
  _M_allocated_capacity = local_18;
  builtin_strncpy(pcVar1,"WriteTestHelper 1.0 __default__",0x1f);
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.writer_ktx2._M_string_length =
       local_18;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.writer_ktx2._M_dataplus._M_p
  [local_18] = '\0';
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.comparisonWriter_ktx2.
  _M_dataplus._M_p =
       (pointer)&(this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.
                 comparisonWriter_ktx2.field_2;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.comparisonWriter_ktx2.
  _M_string_length = 0;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.comparisonWriter_ktx2.field_2.
  _M_local_buf[0] = '\0';
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.images.
  super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.images.
  super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.images.
  super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.imageList.
  super__Vector_base<wthImageInfo,_std::allocator<wthImageInfo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.imageList.
  super__Vector_base<wthImageInfo,_std::allocator<wthImageInfo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.imageList.
  super__Vector_base<wthImageInfo,_std::allocator<wthImageInfo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.texinfo.super_wthTexInfo.
  super_ktxTextureCreateInfo.glInternalformat = 0x822c;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.texinfo.super_wthTexInfo.
  glTypeSize = 2;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.texinfo.super_wthTexInfo.glType
       = 0x1403;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.texinfo.super_wthTexInfo.
  glFormat = 0x8227;
  (this->helper).super_WriterTestHelper<unsigned_short,_2U,_33324U>.texinfo.super_wthTexInfo.
  glBaseInternalformat = 0x8227;
  (this->helper).createInfo.super_ktxTextureCreateInfo.glInternalformat = 0x822c;
  return;
}

Assistant:

ktxTexture1WriteTestBase() { }